

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,SocketFactory *sf,io_context *io_context,string *address,string *port,
          bool port_reuse,int nominalBufferSize)

{
  pointer *ppbVar1;
  long lVar2;
  iterator __position;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined8 *puVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar9;
  long lVar10;
  query query;
  resolver resolver;
  data_union local_118;
  basic_resolver_query<asio::ip::tcp> local_f0;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_80;
  
  (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ioctx = io_context;
  (this->socket_factory).super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this
  .super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->socket_factory).super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this
  .super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar6 = sf->handshake_server;
  (this->socket_factory).encrypted = sf->encrypted;
  (this->socket_factory).handshake_server = bVar6;
  (this->accepting).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->accepting).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->accepting).super___mutex_base._M_mutex + 0x10) = 0;
  (this->accepting).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->accepting).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bufferSize = (long)nominalBufferSize;
  *(undefined8 *)&(this->dataCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->dataCall).super__Function_base._M_functor + 8) = 0;
  (this->dataCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->dataCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->errorCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->errorCall).super__Function_base._M_functor + 8) = 0;
  (this->errorCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->errorCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->logFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->logFunction).super__Function_base._M_functor + 8) = 0;
  (this->logFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->logFunction)._M_invoker = (_Invoker_type)0x0;
  (this->halted)._M_base._M_i = false;
  this->reuse_address = port_reuse;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&local_80,0,0,io_context);
  local_118._0_4_ = 2;
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&local_f0,(protocol_type *)&local_118.base,address,port,canonical_name);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)&local_118.base,
             (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)&local_80,&local_f0);
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_118._12_4_,local_118._8_4_);
  if ((long *)local_118._0_8_ == (long *)0x0) {
    LOCK();
    (this->halted)._M_base._M_i = true;
    UNLOCK();
  }
  else {
    lVar10 = CONCAT44(local_118._20_4_,local_118._16_4_);
    this_00 = this_01;
    uVar9 = local_118._0_8_;
    do {
      lVar2 = *(long *)uVar9;
      lVar8 = lVar10 * 0x60;
      local_118._0_8_ = *(undefined8 *)(lVar2 + lVar8);
      uVar3 = ((undefined8 *)(lVar2 + lVar8))[1];
      puVar7 = (undefined8 *)(lVar2 + 0xc + lVar8);
      uVar4 = puVar7[1];
      local_118._16_4_ = (undefined4)((ulong)*puVar7 >> 0x20);
      local_118._20_4_ = (undefined4)uVar4;
      local_118.v6.sin6_scope_id = (uint32_t)((ulong)uVar4 >> 0x20);
      local_118._8_4_ = (undefined4)uVar3;
      local_118._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
      __position._M_current =
           (this->endpoints).
           super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->endpoints).
          super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
        ::_M_realloc_insert<asio::ip::basic_endpoint<asio::ip::tcp>>
                  ((vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
                    *)&this->endpoints,__position,(basic_endpoint<asio::ip::tcp> *)&local_118.base);
      }
      else {
        puVar7 = (undefined8 *)(lVar2 + lVar8);
        uVar4 = *puVar7;
        uVar5 = puVar7[1];
        uVar3 = puVar7[2];
        ((__position._M_current)->impl_).data_.v6.sin6_scope_id = *(uint32_t *)(puVar7 + 3);
        *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 0x10) = uVar3;
        *(undefined8 *)&((__position._M_current)->impl_).data_ = uVar4;
        *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 8) = uVar5;
        ppbVar1 = &(this->endpoints).
                   super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      lVar10 = lVar10 + 1;
      this_01 = this_00;
      if (lVar10 == (*(long *)(uVar9 + 8) - *(long *)uVar9 >> 5) * -0x5555555555555555) {
        uVar9 = (long *)0x0;
        lVar10 = 0;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          uVar9 = (long *)0x0;
          lVar10 = 0;
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
      }
      this_00 = this_01;
    } while ((long *)uVar9 != (long *)0x0);
    initialConnect(this);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.service_name_._M_dataplus._M_p != &local_f0.service_name_.field_2) {
    operator_delete(local_f0.service_name_._M_dataplus._M_p,
                    local_f0.service_name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.host_name_._M_dataplus._M_p != &local_f0.host_name_.field_2) {
    operator_delete(local_f0.host_name_._M_dataplus._M_p,
                    local_f0.host_name_.field_2._M_allocated_capacity + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&local_80);
  return;
}

Assistant:

TcpServer::TcpServer(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& address,
    const std::string& port,
    bool port_reuse,
    int nominalBufferSize) :
    ioctx(io_context), socket_factory(sf), bufferSize(nominalBufferSize),
    reuse_address(port_reuse)
{
    tcp::resolver resolver(io_context);
    tcp::resolver::query query(
        tcp::v4(), address, port, tcp::resolver::query::canonical_name);
    tcp::resolver::iterator endpoint_iterator = resolver.resolve(query);
    tcp::resolver::iterator end;
    if (endpoint_iterator != end) {
        while (endpoint_iterator != end) {
            endpoints.push_back(*endpoint_iterator);
            ++endpoint_iterator;
        }
    } else {
        halted = true;
        return;
    }
    initialConnect();
}